

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case_simplification.cpp
# Opt level: O0

void __thiscall
duckdb::CaseSimplificationRule::CaseSimplificationRule
          (CaseSimplificationRule *this,ExpressionRewriter *rewriter)

{
  ExpressionRewriter *in_RDI;
  templated_unique_single_t op;
  Rule *in_stack_ffffffffffffffd0;
  
  Rule::Rule(in_stack_ffffffffffffffd0,in_RDI);
  (in_RDI->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__CaseSimplificationRule_035144b0;
  make_uniq<duckdb::CaseExpressionMatcher>();
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::CaseExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_ffffffffffffffd0,
             (unique_ptr<duckdb::CaseExpressionMatcher,_std::default_delete<duckdb::CaseExpressionMatcher>_>
              *)in_RDI);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  operator=((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             *)in_stack_ffffffffffffffd0,
            (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             *)in_RDI);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xcd964a);
  unique_ptr<duckdb::CaseExpressionMatcher,_std::default_delete<duckdb::CaseExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::CaseExpressionMatcher,_std::default_delete<duckdb::CaseExpressionMatcher>,_true>
                 *)0xcd9654);
  return;
}

Assistant:

CaseSimplificationRule::CaseSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on a CaseExpression that has a ConstantExpression as a check
	auto op = make_uniq<CaseExpressionMatcher>();
	root = std::move(op);
}